

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  long lVar1;
  string local_58;
  allocator local_31;
  
  for (lVar1 = 8; lVar1 != 0x68; lVar1 = lVar1 + 0x10) {
    if (*(int *)((long)&__dso_handle + lVar1) == sig) {
      std::__cxx11::string::string
                ((string *)&local_58,*(char **)((long)&signalDefs + lVar1),&local_31);
      fatal(&local_58,-sig);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  std::__cxx11::string::string((string *)&local_58,"<unknown signal>",&local_31);
  fatal(&local_58,-sig);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void handleSignal(int sig) {
			for (std::size_t i = 0; i < sizeof(signalDefs) / sizeof(SignalDefs); ++i)
				if (sig == signalDefs[i].id)
					fatal(signalDefs[i].name, -sig);
			fatal("<unknown signal>", -sig);
		}